

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

match_t * clipp::detail::prefix_match<clipp::detail::select_flags>
                    (match_t *__return_storage_ptr__,scoped_dfs_traverser *pos,arg_string *arg,
                    select_flags *select)

{
  bool bVar1;
  pattern *ppVar2;
  size_type sVar3;
  size_type sVar4;
  scoped_dfs_traverser local_1d0;
  arg_string local_130;
  scoped_dfs_traverser local_100;
  arg_string local_60;
  undefined1 local_40 [8];
  subrange match;
  parameter *param;
  select_flags *select_local;
  arg_string *arg_local;
  scoped_dfs_traverser *pos_local;
  
  do {
    bVar1 = scoped_dfs_traverser::operator_cast_to_bool(pos);
    if (!bVar1) {
      memset(__return_storage_ptr__,0,0xc0);
      match_t::match_t(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    ppVar2 = scoped_dfs_traverser::operator->(pos);
    bVar1 = group::child_t<clipp::parameter,_clipp::group>::is_param(ppVar2);
    if (bVar1) {
      ppVar2 = scoped_dfs_traverser::operator->(pos);
      match.length_ = (size_type)group::child_t<clipp::parameter,_clipp::group>::as_param(ppVar2);
      bVar1 = select_flags::operator()(select,(parameter *)match.length_);
      if (bVar1) {
        _local_40 = parameter::match((parameter *)match.length_,arg);
        bVar1 = subrange::prefix((subrange *)local_40);
        if (bVar1) {
          sVar3 = subrange::length((subrange *)local_40);
          sVar4 = std::__cxx11::string::size();
          if (sVar3 == sVar4) {
            std::__cxx11::string::string((string *)&local_60,(string *)arg);
            scoped_dfs_traverser::scoped_dfs_traverser(&local_100,pos);
            match_t::match_t(__return_storage_ptr__,&local_60,&local_100);
            scoped_dfs_traverser::~scoped_dfs_traverser(&local_100);
            std::__cxx11::string::~string((string *)&local_60);
            return __return_storage_ptr__;
          }
          subrange::at((subrange *)local_40);
          subrange::length((subrange *)local_40);
          std::__cxx11::string::substr((ulong)&local_130,(ulong)arg);
          scoped_dfs_traverser::scoped_dfs_traverser(&local_1d0,pos);
          match_t::match_t(__return_storage_ptr__,&local_130,&local_1d0);
          scoped_dfs_traverser::~scoped_dfs_traverser(&local_1d0);
          std::__cxx11::string::~string((string *)&local_130);
          return __return_storage_ptr__;
        }
      }
    }
    scoped_dfs_traverser::operator++(pos);
  } while( true );
}

Assistant:

match_t
prefix_match(scoped_dfs_traverser pos, const arg_string& arg,
             const ParamSelector& select)
{
    while(pos) {
        if(pos->is_param()) {
            const auto& param = pos->as_param();
            if(select(param)) {
                const auto match = param.match(arg);
                if(match.prefix()) {
                    if(match.length() == arg.size()) {
                        return match_t{arg, std::move(pos)};
                    }
                    else {
                        return match_t{arg.substr(match.at(), match.length()),
                                       std::move(pos)};
                    }
                }
            }
        }
        ++pos;
    }
    return match_t{};
}